

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

void phyr::stratifiedSample2D(Point2f *sample,int nxSamples,int nySamples,bool jitter,RNG *rng)

{
  double *pdVar1;
  byte in_CL;
  int in_EDX;
  int in_ESI;
  double *in_RDI;
  double offY;
  double offX;
  int x;
  int y;
  double invYSamples;
  double invXSamples;
  double local_68;
  RNG *in_stack_ffffffffffffffa0;
  double local_58;
  double local_50;
  double local_48;
  RNG *local_40;
  int local_38;
  int local_34;
  double local_30;
  double local_28;
  byte local_11;
  int local_10;
  int local_c;
  double *local_8;
  
  local_11 = in_CL & 1;
  local_28 = 1.0 / (double)in_ESI;
  local_30 = 1.0 / (double)in_EDX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  for (local_34 = 0; local_34 < local_10; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < local_c; local_38 = local_38 + 1) {
      if ((local_11 & 1) == 0) {
        in_stack_ffffffffffffffa0 = (RNG *)0x3fe0000000000000;
      }
      else {
        in_stack_ffffffffffffffa0 = (RNG *)RNG::uniformReal(in_stack_ffffffffffffffa0);
      }
      local_40 = in_stack_ffffffffffffffa0;
      if ((local_11 & 1) == 0) {
        local_68 = 0.5;
      }
      else {
        local_68 = RNG::uniformReal(in_stack_ffffffffffffffa0);
      }
      local_48 = local_68;
      local_50 = ((double)local_38 + (double)local_40) * local_28;
      pdVar1 = std::min<double>(&local_50,(double *)&OneMinusEpsilon);
      *local_8 = *pdVar1;
      local_58 = ((double)local_34 + local_48) * local_30;
      pdVar1 = std::min<double>(&local_58,(double *)&OneMinusEpsilon);
      local_8[1] = *pdVar1;
      local_8 = local_8 + 2;
    }
  }
  return;
}

Assistant:

void stratifiedSample2D(Point2f* sample, int nxSamples, int nySamples, bool jitter, RNG& rng) {
    Real invXSamples = Real(1) / nxSamples, invYSamples = Real(1) / nySamples;
    for (int y = 0; y < nySamples; y++) {
        for (int x = 0; x < nxSamples; x++) {
            Real offX = jitter ? rng.uniformReal() : 0.5;
            Real offY = jitter ? rng.uniformReal() : 0.5;
            sample->x = std::min((x + offX) * invXSamples, OneMinusEpsilon);
            sample->y = std::min((y + offY) * invYSamples, OneMinusEpsilon);
            ++sample;
        }
    }
}